

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int eval_function_call(lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,
                      lyxp_set *set,int options)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  LY_ERR *pLVar5;
  lyxp_set *plVar6;
  lyxp_set **pplVar7;
  bool bVar8;
  lyxp_set **args_aux;
  lyxp_set **args;
  uint16_t i;
  code *pcStack_48;
  uint16_t arg_count;
  _func_int_lyxp_set_ptr_ptr_uint16_t_lyd_node_ptr_lys_module_ptr_lyxp_set_ptr_int *xpath_func;
  int rc;
  int options_local;
  lyxp_set *set_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  uint16_t *exp_idx_local;
  lyxp_expr *exp_local;
  
  xpath_func._0_4_ = 1;
  pcStack_48 = (code *)0x0;
  args._6_2_ = 0;
  args_aux = (lyxp_set **)0x0;
  if (set != (lyxp_set *)0x0) {
    switch(exp->tok_len[*exp_idx]) {
    case '\x03':
      iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"not",3);
      if (iVar2 == 0) {
        pcStack_48 = xpath_not;
      }
      else {
        iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"sum",3);
        if (iVar2 == 0) {
          pcStack_48 = xpath_sum;
        }
      }
      break;
    case '\x04':
      iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"lang",4);
      if (iVar2 == 0) {
        pcStack_48 = xpath_lang;
      }
      else {
        iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"last",4);
        if (iVar2 == 0) {
          pcStack_48 = xpath_last;
        }
        else {
          iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"name",4);
          if (iVar2 == 0) {
            pcStack_48 = xpath_name;
          }
          else {
            iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"true",4);
            if (iVar2 == 0) {
              pcStack_48 = xpath_true;
            }
          }
        }
      }
      break;
    case '\x05':
      iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"count",5);
      if (iVar2 == 0) {
        pcStack_48 = xpath_count;
      }
      else {
        iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"false",5);
        if (iVar2 == 0) {
          pcStack_48 = xpath_false;
        }
        else {
          iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"floor",5);
          if (iVar2 == 0) {
            pcStack_48 = xpath_floor;
          }
          else {
            iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"round",5);
            if (iVar2 == 0) {
              pcStack_48 = xpath_round;
            }
            else {
              iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"deref",5);
              if (iVar2 == 0) {
                pcStack_48 = xpath_deref;
              }
            }
          }
        }
      }
      break;
    case '\x06':
      iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"concat",6);
      if (iVar2 == 0) {
        pcStack_48 = xpath_concat;
      }
      else {
        iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"number",6);
        if (iVar2 == 0) {
          pcStack_48 = xpath_number;
        }
        else {
          iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"string",6);
          if (iVar2 == 0) {
            pcStack_48 = xpath_string;
          }
        }
      }
      break;
    case '\a':
      iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"boolean",7);
      if (iVar2 == 0) {
        pcStack_48 = xpath_boolean;
      }
      else {
        iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"ceiling",7);
        if (iVar2 == 0) {
          pcStack_48 = xpath_ceiling;
        }
        else {
          iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"current",7);
          if (iVar2 == 0) {
            pcStack_48 = xpath_current;
          }
        }
      }
      break;
    case '\b':
      iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"contains",8);
      if (iVar2 == 0) {
        pcStack_48 = xpath_contains;
      }
      else {
        iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"position",8);
        if (iVar2 == 0) {
          pcStack_48 = xpath_position;
        }
        else {
          iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"re-match",8);
          if (iVar2 == 0) {
            pcStack_48 = xpath_re_match;
          }
        }
      }
      break;
    case '\t':
      iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"substring",9);
      if (iVar2 == 0) {
        pcStack_48 = xpath_substring;
      }
      else {
        iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"translate",9);
        if (iVar2 == 0) {
          pcStack_48 = xpath_translate;
        }
      }
      break;
    case '\n':
      iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"local-name",10);
      if (iVar2 == 0) {
        pcStack_48 = xpath_local_name;
      }
      else {
        iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"enum-value",10);
        if (iVar2 == 0) {
          pcStack_48 = xpath_enum_value;
        }
        else {
          iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"bit-is-set",10);
          if (iVar2 == 0) {
            pcStack_48 = xpath_bit_is_set;
          }
        }
      }
      break;
    case '\v':
      iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"starts-with",0xb);
      if (iVar2 == 0) {
        pcStack_48 = xpath_starts_with;
      }
      break;
    case '\f':
      iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"derived-from",0xc);
      if (iVar2 == 0) {
        pcStack_48 = xpath_derived_from;
      }
      break;
    case '\r':
      iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"namespace-uri",0xd);
      if (iVar2 == 0) {
        pcStack_48 = xpath_namespace_uri;
      }
      else {
        iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"string-length",0xd);
        if (iVar2 == 0) {
          pcStack_48 = xpath_string_length;
        }
      }
      break;
    case '\x0f':
      iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"normalize-space",0xf);
      if (iVar2 == 0) {
        pcStack_48 = xpath_normalize_space;
      }
      else {
        iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"substring-after",0xf);
        if (iVar2 == 0) {
          pcStack_48 = xpath_substring_after;
        }
      }
      break;
    case '\x10':
      iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"substring-before",0x10);
      if (iVar2 == 0) {
        pcStack_48 = xpath_substring_before;
      }
      break;
    case '\x14':
      iVar2 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"derived-from-or-self",0x14);
      if (iVar2 == 0) {
        pcStack_48 = xpath_derived_from_or_self;
      }
    }
    if (pcStack_48 == (code *)0x0) {
      ly_vlog(LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,"Unknown",exp->expr + exp->expr_pos[*exp_idx]
             );
      ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Unknown XPath function \"%.*s\".",
              (ulong)exp->tok_len[*exp_idx],exp->expr + exp->expr_pos[*exp_idx]);
      return -1;
    }
  }
  if ('\x02' < ly_log_level) {
    pcVar3 = "skipped";
    if (set != (lyxp_set *)0x0) {
      pcVar3 = "parsed";
    }
    pcVar4 = print_token(exp->tokens[*exp_idx]);
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_function_call",pcVar3,pcVar4,
               (ulong)exp->expr_pos[*exp_idx]);
  }
  *exp_idx = *exp_idx + 1;
  if ('\x02' < ly_log_level) {
    pcVar3 = "skipped";
    if (set != (lyxp_set *)0x0) {
      pcVar3 = "parsed";
    }
    pcVar4 = print_token(exp->tokens[*exp_idx]);
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_function_call",pcVar3,pcVar4,
               (ulong)exp->expr_pos[*exp_idx]);
  }
  *exp_idx = *exp_idx + 1;
  if (exp->tokens[*exp_idx] == LYXP_TOKEN_PAR2) goto LAB_0019eb2c;
  if (set == (lyxp_set *)0x0) {
    xpath_func._0_4_ = eval_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)0x0,options);
  }
  else {
    args_aux = (lyxp_set **)malloc(8);
    if (args_aux == (lyxp_set **)0x0) {
      pLVar5 = ly_errno_location();
      *pLVar5 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","eval_function_call");
      goto LAB_0019edca;
    }
    args._6_2_ = 1;
    plVar6 = set_copy(set);
    *args_aux = plVar6;
    if (*args_aux == (lyxp_set *)0x0) goto LAB_0019edca;
    xpath_func._0_4_ = eval_expr(exp,exp_idx,cur_node,param_4,*args_aux,options);
  }
  while ((int)xpath_func == 0) {
LAB_0019eb2c:
    while( true ) {
      bVar8 = false;
      if (*exp_idx < exp->used) {
        bVar8 = exp->tokens[*exp_idx] == LYXP_TOKEN_COMMA;
      }
      if (!bVar8) {
        if ('\x02' < ly_log_level) {
          pcVar3 = "skipped";
          if (set != (lyxp_set *)0x0) {
            pcVar3 = "parsed";
          }
          pcVar4 = print_token(exp->tokens[*exp_idx]);
          ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_function_call",pcVar3,pcVar4,
                     (ulong)exp->expr_pos[*exp_idx]);
        }
        *exp_idx = *exp_idx + 1;
        if (set == (lyxp_set *)0x0) {
          xpath_func._0_4_ = 0;
        }
        else {
          xpath_func._0_4_ = (*pcStack_48)(args_aux,args._6_2_,cur_node,param_4,set,options);
        }
        goto LAB_0019edca;
      }
      if ('\x02' < ly_log_level) {
        pcVar3 = "skipped";
        if (set != (lyxp_set *)0x0) {
          pcVar3 = "parsed";
        }
        pcVar4 = print_token(exp->tokens[*exp_idx]);
        ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_function_call",pcVar3,pcVar4,
                   (ulong)exp->expr_pos[*exp_idx]);
      }
      *exp_idx = *exp_idx + 1;
      if (set == (lyxp_set *)0x0) break;
      uVar1 = args._6_2_ + 1;
      pplVar7 = (lyxp_set **)realloc(args_aux,(ulong)uVar1 << 3);
      if (pplVar7 == (lyxp_set **)0x0) {
        pLVar5 = ly_errno_location();
        *pLVar5 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","eval_function_call");
        goto LAB_0019edca;
      }
      plVar6 = set_copy(set);
      pplVar7[(int)(uVar1 - 1)] = plVar6;
      args_aux = pplVar7;
      args._6_2_ = uVar1;
      if ((pplVar7[(int)(uVar1 - 1)] == (lyxp_set *)0x0) ||
         (xpath_func._0_4_ =
               eval_expr(exp,exp_idx,cur_node,param_4,pplVar7[(int)(uVar1 - 1)],options),
         (int)xpath_func != 0)) goto LAB_0019edca;
    }
    xpath_func._0_4_ = eval_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)0x0,options);
  }
LAB_0019edca:
  for (args._4_2_ = 0; args._4_2_ < args._6_2_; args._4_2_ = args._4_2_ + 1) {
    lyxp_set_free(args_aux[args._4_2_]);
  }
  free(args_aux);
  return (int)xpath_func;
}

Assistant:

static int
eval_function_call(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
                   struct lyxp_set *set, int options)
{
    int rc = EXIT_FAILURE;
    int (*xpath_func)(struct lyxp_set **, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int) = NULL;
    uint16_t arg_count = 0, i;
    struct lyxp_set **args = NULL, **args_aux;

    if (set) {
        /* FunctionName */
        switch (exp->tok_len[*exp_idx]) {
        case 3:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "not", 3)) {
                xpath_func = &xpath_not;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "sum", 3)) {
                xpath_func = &xpath_sum;
            }
            break;
        case 4:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "lang", 4)) {
                xpath_func = &xpath_lang;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "last", 4)) {
                xpath_func = &xpath_last;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "name", 4)) {
                xpath_func = &xpath_name;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "true", 4)) {
                xpath_func = &xpath_true;
            }
            break;
        case 5:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "count", 5)) {
                xpath_func = &xpath_count;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "false", 5)) {
                xpath_func = &xpath_false;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "floor", 5)) {
                xpath_func = &xpath_floor;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "round", 5)) {
                xpath_func = &xpath_round;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "deref", 5)) {
                xpath_func = &xpath_deref;
            }
            break;
        case 6:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "concat", 6)) {
                xpath_func = &xpath_concat;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "number", 6)) {
                xpath_func = &xpath_number;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "string", 6)) {
                xpath_func = &xpath_string;
            }
            break;
        case 7:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "boolean", 7)) {
                xpath_func = &xpath_boolean;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "ceiling", 7)) {
                xpath_func = &xpath_ceiling;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "current", 7)) {
                xpath_func = &xpath_current;
            }
            break;
        case 8:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "contains", 8)) {
                xpath_func = &xpath_contains;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "position", 8)) {
                xpath_func = &xpath_position;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "re-match", 8)) {
                xpath_func = &xpath_re_match;
            }
            break;
        case 9:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "substring", 9)) {
                xpath_func = &xpath_substring;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "translate", 9)) {
                xpath_func = &xpath_translate;
            }
            break;
        case 10:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "local-name", 10)) {
                xpath_func = &xpath_local_name;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "enum-value", 10)) {
                xpath_func = &xpath_enum_value;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "bit-is-set", 10)) {
                xpath_func = &xpath_bit_is_set;
            }
            break;
        case 11:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "starts-with", 11)) {
                xpath_func = &xpath_starts_with;
            }
            break;
        case 12:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "derived-from", 12)) {
                xpath_func = &xpath_derived_from;
            }
            break;
        case 13:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "namespace-uri", 13)) {
                xpath_func = &xpath_namespace_uri;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "string-length", 13)) {
                xpath_func = &xpath_string_length;
            }
            break;
        case 15:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "normalize-space", 15)) {
                xpath_func = &xpath_normalize_space;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "substring-after", 15)) {
                xpath_func = &xpath_substring_after;
            }
            break;
        case 16:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "substring-before", 16)) {
                xpath_func = &xpath_substring_before;
            }
            break;
        case 20:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "derived-from-or-self", 20)) {
                xpath_func = &xpath_derived_from_or_self;
            }
            break;
        }

        if (!xpath_func) {
            LOGVAL(LYE_XPATH_INTOK, LY_VLOG_NONE, NULL, "Unknown", &exp->expr[exp->expr_pos[*exp_idx]]);
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL,
                   "Unknown XPath function \"%.*s\".", exp->tok_len[*exp_idx], &exp->expr[exp->expr_pos[*exp_idx]]);
            return -1;
        }
    }

    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
    ++(*exp_idx);

    /* '(' */
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
    ++(*exp_idx);

    /* ( Expr ( ',' Expr )* )? */
    if (exp->tokens[*exp_idx] != LYXP_TOKEN_PAR2) {
        if (set) {
            args = malloc(sizeof *args);
            if (!args) {
                LOGMEM;
                goto cleanup;
            }
            arg_count = 1;
            args[0] = set_copy(set);
            if (!args[0]) {
                goto cleanup;
            }

            if ((rc = eval_expr(exp, exp_idx, cur_node, local_mod, args[0], options))) {
                goto cleanup;
            }
        } else {
            if ((rc = eval_expr(exp, exp_idx, cur_node, local_mod, NULL, options))) {
                goto cleanup;
            }
        }
    }
    while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_COMMA)) {
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

        if (set) {
            ++arg_count;
            args_aux = realloc(args, arg_count * sizeof *args);
            if (!args_aux) {
                arg_count--;
                LOGMEM;
                goto cleanup;
            }
            args = args_aux;
            args[arg_count - 1] = set_copy(set);
            if (!args[arg_count - 1]) {
                goto cleanup;
            }

            if ((rc = eval_expr(exp, exp_idx, cur_node, local_mod, args[arg_count - 1], options))) {
                goto cleanup;
            }
        } else {
            if ((rc = eval_expr(exp, exp_idx, cur_node, local_mod, NULL, options))) {
                goto cleanup;
            }
        }
    }

    /* ')' */
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
    ++(*exp_idx);

    if (set) {
        /* evaluate function */
        rc = xpath_func(args, arg_count, cur_node, local_mod, set, options);
    } else {
        rc = EXIT_SUCCESS;
    }

cleanup:
    for (i = 0; i < arg_count; ++i) {
        lyxp_set_free(args[i]);
    }
    free(args);

    return rc;
}